

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O2

void __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid,VC_ID id)

{
  iterator iVar1;
  TID local_3c;
  pair<unsigned_int,_unsigned_long> local_38;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_28;
  
  local_3c = tid;
  iVar1 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::find<unsigned_int>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)this,&local_3c);
  if (iVar1.ctrl_ ==
      (this->vc).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .ctrl_ + (this->vc).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .capacity_) {
    local_38.first = local_3c;
    local_38.second = id;
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::emplace<std::pair<unsigned_int,_unsigned_long>,_0>
              (&local_28,
               (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                *)this,&local_38);
  }
  else if (*(ulong *)((long)iVar1.field_1.slot_ + 8) < id) {
    *(VC_ID *)((long)iVar1.field_1.slot_ + 8) = id;
  }
  return;
}

Assistant:

void update(TID tid, VC_ID id) {
    auto it = vc.find(tid);
    if (it == vc.end()) {
      vc.insert({tid, id});
    } else {
      if (it->second < id) {
        it->second = id;
      }
    }
  }